

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenMutateArray_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  GenOffset_abi_cxx11_(&local_30,this);
  std::operator+(&local_50,
                 "{{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}, at index: Int32) -> Bool { "
                 ,&local_30);
  std::operator+(__return_storage_ptr__,&local_50,
                 "return {{ACCESS}}.directMutate({{FIELDVAR}}, index: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                );
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenMutateArray() {
    return "{{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}, at "
           "index: Int32) -> Bool { " +
           GenOffset() +
           "return {{ACCESS}}.directMutate({{FIELDVAR}}, index: "
           "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
  }